

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3drv.h
# Opt level: O0

int __thiscall CTPNStmSwitch::gen_code_break(CTPNStmSwitch *this,textchar_t *lbl,size_t lbl_len)

{
  size_t in_RDX;
  textchar_t *in_RSI;
  CTcCodeLabel *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((in_RSI == (textchar_t *)0x0) && (in_RDI[2].fhead == (CTcLabelFixup *)0x0)) {
    iVar1 = 1;
  }
  else {
    iVar1 = CTPNStmEnclosing::gen_code_break_loop
                      ((CTPNStmEnclosing *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
                       in_RDX);
  }
  return iVar1;
}

Assistant:

virtual int gen_code_break(const textchar_t *lbl, size_t lbl_len)
    {
        /* 
         *   if there's no label, and we don't have a 'break' label
         *   ourselves, it must mean that we're processing an unreachable
         *   'break' - we can simply do nothing in this case and pretend we
         *   succeeded 
         */
        if (lbl == 0 && break_lbl_ == 0)
            return TRUE;

        /* break to our break label */
        return gen_code_break_loop(break_lbl_, lbl, lbl_len);
    }